

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall minibag::Player::doKeepAlive(Player *this)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  undefined8 uVar5;
  DurationBase<miniros::WallDuration> *pDVar6;
  TimeBase<miniros::WallTime,_miniros::WallDuration> TVar7;
  WallDuration shift;
  WallTime horizon;
  DurationBase<miniros::Duration> local_50;
  DurationBase<miniros::WallDuration> local_48;
  TimeBase<miniros::Time,_miniros::Duration> local_40;
  TimeBase<miniros::Time,_miniros::Duration> local_38;
  
  local_50.sec = 0;
  local_50.nsec = 0;
  miniros::DurationBase<miniros::Duration>::fromSec(10.0);
  local_38 = (TimeBase<miniros::Time,_miniros::Duration>)
             miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                       (&(this->time_publisher_).current_.
                         super_TimeBase<miniros::Time,_miniros::Duration>,(Duration *)&local_50);
  local_40 = (TimeBase<miniros::Time,_miniros::Duration>)
             TimeTranslator::translate(&this->time_translator_,(Time *)&local_38);
  miniros::normalizeSecNSec(&local_40.sec,&local_40.nsec);
  (this->time_publisher_).horizon_.super_TimeBase<miniros::Time,_miniros::Duration> = local_38;
  (this->time_publisher_).wc_horizon_.super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)local_40;
  if ((this->options_).at_once != false) {
    return;
  }
  this->delayed_ = false;
  do {
    if (this->paused_ == false) {
      uVar5 = miniros::WallTime::now();
      uVar2 = (this->time_publisher_).wc_horizon_.
              super_TimeBase<miniros::WallTime,_miniros::WallDuration>.sec;
      if (uVar2 < (uint)uVar5) {
        return;
      }
      if ((uVar2 == (uint)uVar5) &&
         ((this->time_publisher_).wc_horizon_.
          super_TimeBase<miniros::WallTime,_miniros::WallDuration>.nsec <
          (uint)((ulong)uVar5 >> 0x20))) {
        return;
      }
    }
    cVar3 = miniros::NodeHandle::ok();
    if (cVar3 == '\0') {
      return;
    }
    while (cVar3 = miniros::NodeHandle::ok(), cVar3 != '\0') {
      iVar4 = readCharFromStdin(this);
      if (iVar4 == -1) {
        if (this->paused_ != true) break;
        printTime(this);
        local_50.sec = 0;
        local_50.nsec = 0;
        miniros::DurationBase<miniros::WallDuration>::fromSec(0.1);
        TimePublisher::runStalledClock(&this->time_publisher_,(WallDuration *)&local_50);
        miniros::spinOnce();
      }
      else if (iVar4 == 0x20) {
        bVar1 = this->paused_;
        this->paused_ = (bool)(bVar1 ^ 1);
        if (bVar1 == false) {
          TVar7 = (TimeBase<miniros::WallTime,_miniros::WallDuration>)miniros::WallTime::now();
          (this->paused_time_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> = TVar7;
        }
        else {
          miniros::WallTime::now();
          local_50.sec = 0;
          local_50.nsec = 0;
          pDVar6 = (DurationBase<miniros::WallDuration> *)
                   miniros::DurationBase<miniros::WallDuration>::fromNSec((long)&local_50);
          local_48 = *pDVar6;
          TVar7 = (TimeBase<miniros::WallTime,_miniros::WallDuration>)miniros::WallTime::now();
          (this->paused_time_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> = TVar7;
          miniros::DurationBase<miniros::Duration>::DurationBase((int)&local_50,local_48.sec);
          TimeTranslator::shift(&this->time_translator_,(Duration *)&local_50);
          local_40 = (TimeBase<miniros::Time,_miniros::Duration>)
                     miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+
                               ((TimeBase<miniros::WallTime,_miniros::WallDuration> *)&local_40,
                                (WallDuration *)&local_48);
          (this->time_publisher_).wc_horizon_.
          super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
               (TimeBase<miniros::WallTime,_miniros::WallDuration>)local_40;
        }
      }
    }
    printTime(this);
    local_50.sec = 0;
    local_50.nsec = 0;
    miniros::DurationBase<miniros::WallDuration>::fromSec(0.1);
    TimePublisher::runClock(&this->time_publisher_,(WallDuration *)&local_50);
    miniros::spinOnce();
  } while( true );
}

Assistant:

void Player::doKeepAlive() {
    //Keep pushing ourself out in 10-sec increments (avoids fancy math dealing with the end of time)
    miniros::Time const& time = time_publisher_.getTime() + miniros::Duration(10.0);

    miniros::Time translated = time_translator_.translate(time);
    miniros::WallTime horizon = miniros::WallTime(translated.sec, translated.nsec);

    time_publisher_.setHorizon(time);
    time_publisher_.setWCHorizon(horizon);

    if (options_.at_once) {
        return;
    }

    // If we're done and just staying alive, don't watch the rate control topic. We aren't publishing anyway.
    delayed_ = false;

    while ((paused_ || !time_publisher_.horizonReached()) && node_handle_.ok())
    {
        bool charsleftorpaused = true;
        while (charsleftorpaused && node_handle_.ok())
        {
            switch (readCharFromStdin()){
            case ' ':
                paused_ = !paused_;
                if (paused_) {
                    paused_time_ = miniros::WallTime::now();
                }
                else
                {
                    // Make sure time doesn't shift after leaving pause.
                    miniros::WallDuration shift = miniros::WallTime::now() - paused_time_;
                    paused_time_ = miniros::WallTime::now();
         
                    time_translator_.shift(miniros::Duration(shift.sec, shift.nsec));

                    horizon += shift;
                    time_publisher_.setWCHorizon(horizon);
                }
                break;
            case EOF:
                if (paused_)
                {
                    printTime();
                    time_publisher_.runStalledClock(miniros::WallDuration(.1));
                    miniros::spinOnce();
                }
                else
                    charsleftorpaused = false;
            }
        }

        printTime();
        time_publisher_.runClock(miniros::WallDuration(.1));
        miniros::spinOnce();
    }
}